

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

bool __thiscall QPDF::read_bad_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  InputSource *this_00;
  _Alloc_hider _Var1;
  byte bVar2;
  int iVar3;
  qpdf_offset_t qVar4;
  longlong lVar5;
  bool bVar6;
  byte *pbVar7;
  byte bVar8;
  string f1_str;
  string f2_str;
  string line;
  char *local_158;
  ulong local_150;
  char local_148;
  undefined7 uStack_147;
  char *local_138;
  ulong local_130;
  char local_128;
  undefined7 uStack_127;
  int *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  QPDFExc local_b0;
  
  this_00 = (((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_118 = f2;
  qVar4 = InputSource::getLastOffset(this_00);
  bVar8 = 0;
  (*this_00->_vptr_InputSource[5])(this_00,qVar4,0);
  InputSource::readLine_abi_cxx11_
            (&local_d0,
             (((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x1e);
  _Var1._M_p = local_d0._M_dataplus._M_p;
  while( true ) {
    pbVar7 = (byte *)_Var1._M_p + 1;
    bVar2 = *_Var1._M_p;
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) break;
    bVar8 = 1;
    _Var1._M_p = (pointer)pbVar7;
  }
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar6 = false;
    goto LAB_0022829d;
  }
  local_158 = &local_148;
  local_150 = 0;
  local_148 = '\0';
  for (; bVar2 = pbVar7[-1], (byte)(bVar2 - 0x30) < 10; pbVar7 = pbVar7 + 1) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_158,local_150,0,'\x01');
  }
  if ((bVar2 - 9 < 5) || (bVar2 == 0x20)) {
    if ((byte)(*pbVar7 - 9) < 0x18) {
      bVar8 = bVar8 | (byte)(0x80001f >> (*pbVar7 - 9 & 0x1f));
    }
    while ((bVar2 - 9 < 5 || (bVar2 == 0x20))) {
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    }
    if (9 < (byte)(bVar2 - 0x30)) goto LAB_0022824a;
    local_138 = &local_128;
    local_130 = 0;
    local_128 = '\0';
    for (; bVar2 = pbVar7[-1], (byte)(bVar2 - 0x30) < 10; pbVar7 = pbVar7 + 1) {
      std::__cxx11::string::_M_replace_aux((ulong)&local_138,local_130,0,'\x01');
    }
    if ((bVar2 - 9 < 5) || (bVar2 == 0x20)) {
      if ((byte)(*pbVar7 - 9) < 0x18) {
        bVar8 = (byte)(0x80001f >> (*pbVar7 - 9 & 0x1f)) | bVar8;
      }
      while ((bVar2 - 9 < 5 || (bVar2 == 0x20))) {
        bVar2 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      }
      if ((bVar2 != 0x66) && (bVar2 != 0x6e)) goto LAB_0022825c;
      *type = bVar2;
      if ((bVar8 & 1) != 0 || (local_130 != 5 || local_150 != 10)) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"xref table","");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"accepting invalid xref table entry","");
        damagedPDF(&local_b0,this,&local_f0,&local_110);
        warn(this,&local_b0);
        QPDFExc::~QPDFExc(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
      lVar5 = QUtil::string_to_ll(local_158);
      *f1 = lVar5;
      iVar3 = QUtil::string_to_int(local_138);
      *local_118 = iVar3;
      bVar6 = true;
    }
    else {
LAB_0022825c:
      bVar6 = false;
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
    }
  }
  else {
LAB_0022824a:
    bVar6 = false;
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
LAB_0022829d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool
QPDF::read_bad_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    // Reposition after initial read attempt and reread.
    m->file->seek(m->file->getLastOffset(), SEEK_SET);
    auto line = m->file->readLine(30);

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.data();

    // Skip zero or more spaces. There aren't supposed to be any.
    bool invalid = false;
    while (util::is_space(*p)) {
        ++p;
        QTC::TC("qpdf", "QPDF ignore first space in xref entry");
        invalid = true;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f1_str;
    while (util::is_digit(*p)) {
        f1_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore first extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f2_str;
    while (util::is_digit(*p)) {
        f2_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore second extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    if ((*p == 'f') || (*p == 'n')) {
        type = *p;
    } else {
        return false;
    }
    if ((f1_str.length() != 10) || (f2_str.length() != 5)) {
        QTC::TC("qpdf", "QPDF ignore length error xref entry");
        invalid = true;
    }

    if (invalid) {
        warn(damagedPDF("xref table", "accepting invalid xref table entry"));
    }

    f1 = QUtil::string_to_ll(f1_str.c_str());
    f2 = QUtil::string_to_int(f2_str.c_str());

    return true;
}